

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_write(htsFile *hfp,bcf_hdr_t *h,bcf1_t *v)

{
  BGZF *fp_00;
  FILE *__stream;
  char *pcVar1;
  ssize_t sVar2;
  size_t sVar3;
  int local_58;
  undefined4 local_54;
  uint32_t x [8];
  BGZF *fp;
  bcf1_t *v_local;
  bcf_hdr_t *h_local;
  htsFile *hfp_local;
  
  __stream = _stderr;
  if (h->dirty != 0) {
    fprintf(_stderr,"FIXME: dirty header not synced\n");
    exit(1);
  }
  if (h->n[2] == (uint)((ulong)*(undefined8 *)&v->field_0x10 >> 0x28)) {
    if (((hfp->format).format == vcf) || ((hfp->format).format == text_format)) {
      hfp_local._4_4_ = vcf_write(hfp,h,v);
    }
    else {
      if (v->errcode != 0) {
        fprintf(_stderr,"[%s:%d %s] Unchecked error (%d), exiting.\n",
                "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                ,0x49b,"bcf_write",(ulong)(uint)v->errcode);
        exit(1);
      }
      bcf1_sync(v);
      fp_00 = (hfp->fp).bgzf;
      local_58 = (int)(v->shared).l + 0x18;
      local_54 = (undefined4)(v->indiv).l;
      x[0] = v->rid;
      x[1] = v->pos;
      x[2] = v->rlen;
      x[3] = (uint32_t)v->qual;
      x[4] = (int)((ulong)*(undefined8 *)&v->field_0x10 >> 0x10) << 0x10 |
             (uint)*(undefined8 *)&v->field_0x10 & 0xffff;
      x[5] = (int)((ulong)*(undefined8 *)&v->field_0x10 >> 0x20) << 0x18 |
             (uint)((ulong)*(undefined8 *)&v->field_0x10 >> 0x28);
      sVar2 = bgzf_write(fp_00,&local_58,0x20);
      if (sVar2 == 0x20) {
        sVar3 = bgzf_write(fp_00,(v->shared).s,(v->shared).l);
        if (sVar3 == (v->shared).l) {
          sVar3 = bgzf_write(fp_00,(v->indiv).s,(v->indiv).l);
          if (sVar3 == (v->indiv).l) {
            hfp_local._4_4_ = 0;
          }
          else {
            hfp_local._4_4_ = -1;
          }
        }
        else {
          hfp_local._4_4_ = -1;
        }
      }
      else {
        hfp_local._4_4_ = -1;
      }
    }
  }
  else {
    pcVar1 = bcf_seqname(h,v);
    fprintf(__stream,
            "[%s:%d %s] Broken VCF record, the number of columns at %s:%d does not match the number of samples (%d vs %d).\n"
            ,
            "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
            ,0x48e,"bcf_write",pcVar1,v->pos + 1,
            (uint)((ulong)*(undefined8 *)&v->field_0x10 >> 0x28),h->n[2]);
    hfp_local._4_4_ = -1;
  }
  return hfp_local._4_4_;
}

Assistant:

int bcf_write(htsFile *hfp, const bcf_hdr_t *h, bcf1_t *v)
{
    if ( h->dirty )
    {
        // we could as well call bcf_hdr_sync here, not sure
        fprintf(stderr,"FIXME: dirty header not synced\n");
        exit(1);
    }
    if ( bcf_hdr_nsamples(h)!=v->n_sample )
    {
        fprintf(stderr,"[%s:%d %s] Broken VCF record, the number of columns at %s:%d does not match the number of samples (%d vs %d).\n",
                __FILE__,__LINE__,__FUNCTION__,bcf_seqname(h,v),v->pos+1, v->n_sample,bcf_hdr_nsamples(h));
        return -1;
    }

    if ( hfp->format.format == vcf || hfp->format.format == text_format )
        return vcf_write(hfp,h,v);

    if ( v->errcode )
    {
        // vcf_parse1() encountered a new contig or tag, undeclared in the
        // header.  At this point, the header must have been printed,
        // proceeding would lead to a broken BCF file. Errors must be checked
        // and cleared by the caller before we can proceed.
        fprintf(stderr,"[%s:%d %s] Unchecked error (%d), exiting.\n", __FILE__,__LINE__,__FUNCTION__,v->errcode);
        exit(1);
    }
    bcf1_sync(v);   // check if the BCF record was modified

    BGZF *fp = hfp->fp.bgzf;
    uint32_t x[8];
    x[0] = v->shared.l + 24; // to include six 32-bit integers
    x[1] = v->indiv.l;
    memcpy(x + 2, v, 16);
    x[6] = (uint32_t)v->n_allele<<16 | v->n_info;
    x[7] = (uint32_t)v->n_fmt<<24 | v->n_sample;
    if ( bgzf_write(fp, x, 32) != 32 ) return -1;
    if ( bgzf_write(fp, v->shared.s, v->shared.l) != v->shared.l ) return -1;
    if ( bgzf_write(fp, v->indiv.s, v->indiv.l) != v->indiv.l ) return -1;
    return 0;
}